

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vendor.cpp
# Opt level: O0

int deal(int signal,double *income,double *balance,double pr)

{
  ostream *poVar1;
  int local_2c;
  int isok;
  double pr_local;
  double *balance_local;
  double *income_local;
  int signal_local;
  
  if (signal == -1) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "-------------------------------------------------------------------------"
                            );
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"Here is the refund:");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*income);
    poVar1 = std::operator<<(poVar1,"yuan.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<(poVar1,"back");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "-------------------------------------------------------------------------"
                            );
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    *income = 0.0;
    local_2c = -1;
    buttonback();
  }
  else if (signal == 0) {
    *balance = *balance - (*income - pr);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "-------------------------------------------------------------------------"
                            );
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"Here is the charge: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*income - pr);
    poVar1 = std::operator<<(poVar1," yuan.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"Payment is successful! Thank you!");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<(poVar1,"back");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "-------------------------------------------------------------------------"
                            );
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    *balance = *balance + *income;
    *income = 0.0;
    local_2c = 0;
    buttonback();
  }
  else if (signal == 1) {
    *balance = *balance + *income;
    *income = 0.0;
    local_2c = 0;
  }
  return local_2c;
}

Assistant:

int deal(int signal, double &income, double &balance, double pr) {
    int isok;
    switch (signal) {
        case 1:
            balance = balance + income;
            income = 0;
            isok = 0;
            break;
        case 0:
            balance = balance - (income - pr);
            frame
            cout << "Here is the charge: " << income - pr << " yuan." << endl;
            cout << "Payment is successful! Thank you!" << endl;
            cout << endl << endl << "back" << endl;
            frame
            balance = balance + income;
            income = 0;
            isok = 0;
            buttonback();
            break;
        case -1:
            frame
            cout << "Here is the refund:" << income << "yuan." << endl;
            cout << endl << endl << "back" << endl;
            frame
            income = 0;
            isok = -1;
            buttonback();
            break;
    }
    return isok;
}